

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteRestrictionManager.h
# Opt level: O1

void __thiscall
jaegertracing::baggage::RemoteRestrictionManager::~RemoteRestrictionManager
          (RemoteRestrictionManager *this)

{
  pointer pcVar1;
  int in_ESI;
  
  (this->super_RestrictionManager)._vptr_RestrictionManager =
       (_func_int **)&PTR__RemoteRestrictionManager_002675d8;
  close(this,in_ESI);
  std::condition_variable::~condition_variable(&this->_cv);
  if ((this->_thread)._M_id._M_thread != 0) {
    std::terminate();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_restrictions)._M_h);
  pcVar1 = (this->_serviceName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_serviceName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~RemoteRestrictionManager() { close(); }